

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O3

aiMatrix4x4 * __thiscall
Assimp::X3DImporter::PostprocessHelper_Matrix_GlobalToCurrent
          (aiMatrix4x4 *__return_storage_ptr__,X3DImporter *this)

{
  long *******ppppppplVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  long *******ppppppplVar12;
  _List_iterator<aiMatrix4x4t<float>_> __tmp;
  CX3DImporter_NodeElement *pCVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> matr;
  float local_f8;
  long *******local_d0;
  long *******local_c8;
  long local_c0;
  long ******local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  long ******local_98;
  undefined8 uStack_90;
  long ******local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  long ******local_68;
  undefined8 uStack_60;
  long ******local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  local_c8 = (long *******)&local_d0;
  local_d0 = (long *******)&local_d0;
  local_c0 = 0;
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  pCVar13 = this->NodeElement_Cur;
  local_f8 = 0.0;
  if (pCVar13 != (CX3DImporter_NodeElement *)0x0) {
    ppppppplVar12 = (long *******)&local_d0;
    do {
      if (pCVar13->Type == ENET_Group) {
        p_Var11 = (_List_node_base *)operator_new(0x50);
        p_Var5 = (_List_node_base *)pCVar13[1]._vptr_CX3DImporter_NodeElement;
        p_Var6 = *(_List_node_base **)&pCVar13[1].Type;
        p_Var7 = (_List_node_base *)pCVar13[1].ID._M_dataplus._M_p;
        p_Var8 = (_List_node_base *)pCVar13[1].ID._M_string_length;
        p_Var9 = (_List_node_base *)pCVar13[1].ID.field_2._M_allocated_capacity;
        p_Var10 = *(_List_node_base **)((long)&pCVar13[1].ID.field_2 + 8);
        uVar2 = *(undefined4 *)((long)&pCVar13[1].Parent + 4);
        uVar3 = *(undefined4 *)
                 &pCVar13[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        uVar4 = *(undefined4 *)
                 ((long)&pCVar13[1].Child.
                         super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         ._M_impl._M_node.super__List_node_base._M_next + 4);
        *(undefined4 *)&p_Var11[4]._M_next = *(undefined4 *)&pCVar13[1].Parent;
        *(undefined4 *)((long)&p_Var11[4]._M_next + 4) = uVar2;
        *(undefined4 *)&p_Var11[4]._M_prev = uVar3;
        *(undefined4 *)((long)&p_Var11[4]._M_prev + 4) = uVar4;
        p_Var11[3]._M_next = p_Var9;
        p_Var11[3]._M_prev = p_Var10;
        p_Var11[2]._M_next = p_Var7;
        p_Var11[2]._M_prev = p_Var8;
        p_Var11[1]._M_next = p_Var5;
        p_Var11[1]._M_prev = p_Var6;
        std::__detail::_List_node_base::_M_hook(p_Var11);
        local_c0 = local_c0 + 1;
      }
      pCVar13 = pCVar13->Parent;
    } while (pCVar13 != (CX3DImporter_NodeElement *)0x0);
    bVar14 = ppppppplVar12 == local_d0;
    if (!bVar14) {
      fStack_74 = 0.0;
      local_78 = 0.0;
      fVar51 = 0.0;
      fVar53 = 1.0;
      fVar55 = 0.0;
      fVar56 = 0.0;
      fVar27 = 1.0;
      fVar24 = 0.0;
      fVar26 = 0.0;
      fVar23 = 0.0;
      fVar25 = 0.0;
      fVar30 = 0.0;
      fVar62 = 0.0;
      fVar64 = 0.0;
      fVar15 = 0.0;
      fVar28 = 0.0;
      fVar29 = 0.0;
      fVar48 = 0.0;
      fVar16 = 1.0;
      fVar17 = 0.0;
      fVar57 = fVar51;
      fVar58 = fVar53;
      fVar59 = fVar55;
      fVar60 = fVar56;
      do {
        local_48 = fVar48;
        fStack_44 = fVar48;
        fStack_40 = fVar48;
        fStack_3c = fVar48;
        local_28 = fVar51;
        fStack_24 = fVar53;
        fStack_20 = fVar55;
        fStack_1c = fVar56;
        local_a8 = fVar57;
        fStack_a4 = fVar58;
        fStack_a0 = fVar59;
        fStack_9c = fVar60;
        ppppppplVar12 = (long *******)ppppppplVar12[1];
        local_88 = ppppppplVar12[2];
        fVar36 = SUB84(local_88,0);
        fVar42 = (float)((ulong)local_88 >> 0x20);
        local_68 = ppppppplVar12[4];
        fVar19 = SUB84(local_68,0);
        fVar20 = (float)((ulong)local_68 >> 0x20);
        uStack_60 = 0;
        uStack_80 = 0;
        local_98 = ppppppplVar12[6];
        fVar50 = SUB84(local_98,0);
        fVar52 = (float)((ulong)local_98 >> 0x20);
        uStack_90 = 0;
        fVar22 = SUB84(ppppppplVar12[8],0);
        fVar21 = (float)((ulong)ppppppplVar12[8] >> 0x20);
        fVar33 = fVar22 * fStack_74 + fVar50 * local_78 + fVar36 * fVar16 + fVar17 * fVar19;
        fVar35 = fVar21 * fStack_74 + fVar52 * local_78 + fVar42 * fVar16 + fVar17 * fVar20;
        local_38 = fVar33;
        fStack_34 = fVar35;
        fStack_30 = fStack_74 * 0.0 + local_78 * 0.0 + fVar16 * 0.0 + fVar17 * 0.0;
        fStack_2c = fStack_74 * 0.0 + local_78 * 0.0 + fVar16 * 0.0 + fVar17 * 0.0;
        fVar34 = fVar22 * fVar23 + fVar50 * fVar28 + fVar36 * fVar29 + fVar58 * fVar19;
        fVar37 = SUB84(ppppppplVar12[5],0);
        fVar43 = (float)((ulong)ppppppplVar12[5] >> 0x20);
        fVar38 = SUB84(ppppppplVar12[3],0);
        fVar44 = (float)((ulong)ppppppplVar12[3] >> 0x20);
        local_b8 = ppppppplVar12[7];
        fVar39 = SUB84(local_b8,0);
        fVar18 = (float)((ulong)local_b8 >> 0x20);
        fVar61 = local_78 * 0.0;
        fVar63 = local_78 * 0.0;
        uStack_b0 = 0;
        local_58 = ppppppplVar12[9];
        fVar40 = SUB84(local_58,0);
        fVar45 = (float)((ulong)local_58 >> 0x20);
        fVar55 = fStack_74 * 0.0;
        fVar56 = fStack_74 * 0.0;
        uStack_50 = 0;
        fVar54 = fStack_74 * fVar40 + local_78 * fVar39 + fVar16 * fVar38 + fVar17 * fVar37;
        fStack_74 = fStack_74 * fVar45 + local_78 * fVar18 + fVar16 * fVar44 + fVar17 * fVar43;
        local_78 = fVar54;
        fStack_70 = fVar55 + fVar61 + fVar16 * 0.0 + fVar17 * 0.0;
        fStack_6c = fVar56 + fVar63 + fVar16 * 0.0 + fVar17 * 0.0;
        local_f8 = fVar23 * fVar40 + fVar28 * fVar39 + fVar29 * fVar38 + fVar58 * fVar37;
        fVar16 = fVar19 * fVar57;
        fVar17 = fVar43 * fVar58;
        fVar55 = fVar59 * 0.0;
        fVar56 = fVar60 * 0.0;
        fVar41 = fVar57 * fVar37;
        fVar46 = fVar57 * fVar43;
        fVar47 = fVar57 * 0.0;
        fVar49 = fVar57 * 0.0;
        fVar61 = fVar30 * fVar38;
        fVar63 = fVar30 * fVar44;
        fVar31 = fVar30 * 0.0;
        fVar32 = fVar30 * 0.0;
        fVar57 = fVar21 * fVar25 + fVar52 * fVar27 + fVar42 * fVar30 + fVar20 * fVar57;
        fVar58 = fVar21 * fVar23 + fVar52 * fVar28 + fVar42 * fVar29 + fVar20 * fVar58;
        fVar59 = fVar21 * fVar25 + fVar52 * fVar24 + fVar42 * fVar62 + fVar20 * fVar59;
        fVar60 = fVar21 * fVar25 + fVar52 * fVar26 + fVar42 * fVar64 + fVar20 * fVar60;
        fVar30 = fVar22 * fVar25 + fVar50 * fVar27 + fVar36 * fVar30 + fVar16;
        fVar23 = fVar45 * fVar23 + fVar18 * fVar28 + fVar44 * fVar29 + fVar17;
        fVar62 = fVar25 * 0.0 + fVar24 * 0.0 + fVar62 * 0.0 + fVar55;
        fVar64 = fVar25 * 0.0 + fVar26 * 0.0 + fVar64 * 0.0 + fVar56;
        fVar28 = fVar27 * fVar18;
        fVar29 = fVar27 * 0.0;
        fVar16 = fVar27 * 0.0;
        fVar24 = fVar25 * 0.0;
        fVar26 = fVar25 * 0.0;
        fVar27 = fVar25 * fVar40 + fVar27 * fVar39 + fVar61 + fVar41;
        fVar25 = fVar25 * fVar45 + fVar28 + fVar63 + fVar46;
        fVar24 = fVar24 + fVar29 + fVar31 + fVar47;
        fVar26 = fVar26 + fVar16 + fVar32 + fVar49;
        fVar19 = fVar22 * fVar53 + fVar50 * fVar51 + fVar36 * fVar15 + fVar19 * fVar48;
        fVar22 = fVar21 * fVar53 + fVar52 * fVar51 + fVar42 * fVar15 + fVar20 * fVar48;
        fVar18 = fVar51 * fVar18;
        fVar28 = fVar51 * 0.0;
        fVar29 = fVar51 * 0.0;
        fVar55 = fVar53 * 0.0;
        fVar56 = fVar53 * 0.0;
        fVar51 = fVar53 * fVar40 + fVar51 * fVar39 + fVar15 * fVar38 + fVar48 * fVar37;
        fVar53 = fVar53 * fVar45 + fVar18 + fVar15 * fVar44 + fVar48 * fVar43;
        fVar55 = fVar55 + fVar28 + fVar15 * 0.0 + fVar48 * 0.0;
        fVar56 = fVar56 + fVar29 + fVar15 * 0.0 + fVar48 * 0.0;
        fVar15 = fVar19;
        fVar28 = local_f8;
        fVar29 = fVar34;
        fVar48 = fVar22;
        fVar16 = local_38;
        fVar17 = fStack_34;
      } while (ppppppplVar12 != local_d0);
      __return_storage_ptr__->a3 = fVar54;
      __return_storage_ptr__->a4 = fStack_74;
      __return_storage_ptr__->b1 = fVar34;
      __return_storage_ptr__->b4 = fVar23;
      __return_storage_ptr__->c1 = fVar30;
      __return_storage_ptr__->c2 = fVar57;
      __return_storage_ptr__->d1 = fVar19;
      __return_storage_ptr__->d2 = fVar22;
      __return_storage_ptr__->d3 = fVar51;
      goto LAB_0062ecae;
    }
  }
  bVar14 = true;
  fVar58 = 1.0;
  fVar53 = 1.0;
  fVar35 = 0.0;
  fVar33 = 1.0;
  fVar27 = fVar33;
  fVar25 = fVar35;
LAB_0062ecae:
  __return_storage_ptr__->a1 = fVar33;
  __return_storage_ptr__->a2 = fVar35;
  __return_storage_ptr__->b2 = fVar58;
  __return_storage_ptr__->b3 = local_f8;
  __return_storage_ptr__->c3 = fVar27;
  __return_storage_ptr__->c4 = fVar25;
  __return_storage_ptr__->d4 = fVar53;
  if (!bVar14) {
    ppppppplVar12 = local_d0;
    do {
      ppppppplVar1 = (long *******)*ppppppplVar12;
      operator_delete(ppppppplVar12,0x50);
      ppppppplVar12 = ppppppplVar1;
    } while ((long ********)ppppppplVar1 != &local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 X3DImporter::PostprocessHelper_Matrix_GlobalToCurrent() const
{
    CX3DImporter_NodeElement* cur_node;
    std::list<aiMatrix4x4> matr;
    aiMatrix4x4 out_matr;

	// starting walk from current element to root
	cur_node = NodeElement_Cur;
	if(cur_node != nullptr)
	{
		do
		{
			// if cur_node is group then store group transformation matrix in list.
			if(cur_node->Type == CX3DImporter_NodeElement::ENET_Group) matr.push_back(((CX3DImporter_NodeElement_Group*)cur_node)->Transformation);

			cur_node = cur_node->Parent;
		} while(cur_node != nullptr);
	}

	// multiplicate all matrices in reverse order
	for(std::list<aiMatrix4x4>::reverse_iterator rit = matr.rbegin(); rit != matr.rend(); ++rit) out_matr = out_matr * (*rit);

	return out_matr;
}